

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_value(basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          json_visitor *visitor,uint8_t type,error_code *ec)

{
  size_t *psVar1;
  stream_source<unsigned_char> *this_00;
  string_type *buffer;
  char *first;
  pointer ppVar2;
  pointer puVar3;
  pointer pcVar4;
  int iVar5;
  bson_errc __e;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  ssize_t sVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar15;
  _func_int **pp_Var16;
  undefined7 in_register_00000011;
  size_t length;
  size_t length_00;
  undefined8 uVar17;
  ulong uVar18;
  int __fd;
  uint8_t *puVar19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *v;
  type tVar20;
  decimal128_to_chars_result dVar21;
  undefined8 uStack_b0;
  uint8_t buf [8];
  uint8_t buf_4 [4];
  uint8_t uStack_94;
  uint8_t uStack_93;
  uint8_t uStack_92;
  uint8_t uStack_91;
  ulong uStack_90;
  uint8_t subtype;
  pointer local_38;
  
  puVar19 = buf;
  iVar5 = (int)CONCAT71(in_register_00000011,type);
  __fd = (int)buf;
  switch(iVar5) {
  case 1:
    sVar14 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x8,0x7f8688);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar14;
    if (sVar14 == 8) {
      (*visitor->_vptr_basic_json_visitor[0x12])(buf._0_4_,visitor,0,this,ec);
LAB_0015f7c4:
      bVar13 = this->cursor_mode_ ^ 1;
      goto LAB_0015f7c9;
    }
    break;
  case 3:
    begin_document(this,visitor,ec);
    return;
  case 4:
    begin_array(this,visitor,ec);
    return;
  case 5:
    this_00 = &this->source_;
    sVar14 = stream_source<unsigned_char>::read(this_00,(int)buf_4,(void *)0x4,0x7f8688);
    ppVar2 = (this->state_stack_).
             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar1 = &ppVar2[-1].pos;
    *psVar1 = *psVar1 + sVar14;
    if (sVar14 != 4) {
      __e = unexpected_eof;
      goto LAB_0015f284;
    }
    v = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(long)(int)buf_4;
    if ((long)v < 0) {
      __e = length_is_negative;
      goto LAB_0015f284;
    }
    sVar14 = stream_source<unsigned_char>::read(this_00,(int)&subtype,(void *)0x1,(size_t)ppVar2);
    ppVar2 = (this->state_stack_).
             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar1 = &ppVar2[-1].pos;
    *psVar1 = *psVar1 + sVar14;
    if (sVar14 == 1) {
      puVar3 = (this->bytes_buffer_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar3) {
        (this->bytes_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar3;
      }
      pvVar15 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                source_reader<jsoncons::stream_source<unsigned_char>>::
                read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          ((source_reader<jsoncons::stream_source<unsigned_char>> *)this_00,
                           (stream_source<unsigned_char> *)&this->bytes_buffer_,v,(size_t)ppVar2);
      psVar1 = &(this->state_stack_).
                super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
      *psVar1 = (long)&(pvVar15->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + *psVar1;
      if (pvVar15 == v) {
        buf = (uint8_t  [8])
              (this->bytes_buffer_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
        (*visitor->_vptr_basic_json_visitor[0xe])(visitor,buf,_subtype & 0xff,this,ec);
        goto LAB_0015f7c4;
      }
    }
    break;
  case 6:
    pp_Var16 = visitor->_vptr_basic_json_visitor;
    uVar17 = 0xd;
    goto LAB_0015f742;
  case 7:
    sVar14 = stream_source<unsigned_char>::read(&this->source_,(int)buf_4,(void *)0xc,0x7f8688);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar14;
    if (sVar14 == 0xc) {
      uVar18 = (ulong)_buf_4 & 0xff;
      uVar6 = (ulong)_buf_4 >> 8;
      uVar7 = (ulong)_buf_4 >> 0x10;
      uVar8 = (ulong)_buf_4 >> 0x18;
      uVar9 = (ulong)_buf_4 >> 0x20;
      uVar10 = (ulong)_buf_4 >> 0x28;
      uVar11 = (ulong)_buf_4 >> 0x30;
      uVar12 = (ulong)_buf_4 >> 0x38;
      std::__cxx11::string::resize((ulong)&this->text_buffer_,'\x18');
      pcVar4 = (this->text_buffer_)._M_dataplus._M_p;
      *(undefined2 *)pcVar4 =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            uVar18 * 2);
      *(undefined2 *)(pcVar4 + 2) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar6 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 4) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar7 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 6) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar8 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 8) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar9 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 10) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar10 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 0xc) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uVar11 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 0xe) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            uVar12 * 2);
      *(undefined2 *)(pcVar4 + 0x10) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uStack_90 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 0x12) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uStack_90 >> 8 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 0x14) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uStack_90 >> 0x10 & 0xff) * 2);
      *(undefined2 *)(pcVar4 + 0x16) =
           *(undefined2 *)
            (detail::get_hex_char_pairs(std::integral_constant<bool,false>)::hex_char_pairs +
            (uStack_90 >> 0x18 & 0xff) * 2);
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var16 = visitor->_vptr_basic_json_visitor;
      uStack_b0 = 0x13;
LAB_0015f6d9:
      (*pp_Var16[0xc])(visitor,puVar19,uStack_b0,this,ec);
      goto LAB_0015f7c4;
    }
    break;
  case 8:
    sVar14 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x1,0x7f8688);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar14;
    if (sVar14 == 1) {
      (*visitor->_vptr_basic_json_visitor[0xb])(visitor,(ulong)(buf[0] != '\0'),0,this,ec);
      goto LAB_0015f7c4;
    }
    break;
  case 9:
    sVar14 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x8,0x7f8688);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar14;
    if (sVar14 == 8) {
      pp_Var16 = visitor->_vptr_basic_json_visitor;
      uVar17 = 6;
LAB_0015f781:
      (*pp_Var16[0x10])(visitor,buf,uVar17,this,ec);
      goto LAB_0015f7c4;
    }
    break;
  case 10:
    pp_Var16 = visitor->_vptr_basic_json_visitor;
    uVar17 = 0;
LAB_0015f742:
    (*pp_Var16[10])(visitor,uVar17,this,ec);
    goto LAB_0015f74b;
  case 0xb:
    (this->text_buffer_)._M_string_length = 0;
    buffer = &this->text_buffer_;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    std::__cxx11::string::push_back((char)buffer);
    read_cstring(this,buffer,ec);
    if (ec->_M_value != 0) {
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var16 = visitor->_vptr_basic_json_visitor;
    uStack_b0 = 0x14;
    goto LAB_0015f48e;
  case 0xc:
  case 0xf:
switchD_0015f1c3_caseD_c:
    __e = unknown_type;
    goto LAB_0015f284;
  case 0xd:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar20 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length_00);
    if (tVar20.ec == success) {
      buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
      pp_Var16 = visitor->_vptr_basic_json_visitor;
      uStack_b0 = 0x15;
      goto LAB_0015f48e;
    }
    goto LAB_0015f7ea;
  case 0x10:
    sVar14 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x4,0x7f8688);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar14;
    if (sVar14 == 4) {
      buf = (uint8_t  [8])(long)(int)buf._0_4_;
LAB_0015f779:
      pp_Var16 = visitor->_vptr_basic_json_visitor;
      uVar17 = 0;
      goto LAB_0015f781;
    }
    break;
  case 0x11:
    sVar14 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x8,0x7f8688);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar14;
    if (sVar14 == 8) {
      (*visitor->_vptr_basic_json_visitor[0xf])(visitor,buf,0,this,ec);
      goto LAB_0015f7c4;
    }
    break;
  case 0x12:
    sVar14 = stream_source<unsigned_char>::read(&this->source_,__fd,(void *)0x8,0x7f8688);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar14;
    if (sVar14 == 8) goto LAB_0015f779;
    break;
  case 0x13:
    sVar14 = stream_source<unsigned_char>::read(&this->source_,__fd,&DAT_00000010,0x7f8688);
    psVar1 = &(this->state_stack_).
              super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].pos;
    *psVar1 = *psVar1 + sVar14;
    if (sVar14 == 0x10) {
      buf_4[0] = buf[0];
      buf_4[1] = buf[1];
      buf_4[2] = buf[2];
      buf_4[3] = buf[3];
      uStack_94 = buf[4];
      uStack_93 = buf[5];
      uStack_92 = buf[6];
      uStack_91 = buf[7];
      (this->text_buffer_)._M_string_length = 0;
      *(this->text_buffer_)._M_dataplus._M_p = '\0';
      std::__cxx11::string::resize((ulong)&this->text_buffer_,'*');
      first = (this->text_buffer_)._M_dataplus._M_p;
      dVar21 = decimal128_to_chars(first,first + (this->text_buffer_)._M_string_length,
                                   (decimal128_t *)buf_4);
      local_38 = (this->text_buffer_)._M_dataplus._M_p;
      _subtype = (long)dVar21.ptr - (long)local_38;
      puVar19 = &subtype;
      pp_Var16 = visitor->_vptr_basic_json_visitor;
      uStack_b0 = 0xb;
      goto LAB_0015f6d9;
    }
    break;
  default:
    if ((iVar5 != 0x7f) && (iVar5 != 0xff)) goto switchD_0015f1c3_caseD_c;
  case 2:
  case 0xe:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar20 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length);
    if (tVar20.ec != success) {
LAB_0015f7ea:
      __e = invalid_utf8_text_string;
LAB_0015f284:
      std::error_code::operator=(ec,__e);
      this->more_ = false;
      return;
    }
    buf = (uint8_t  [8])(this->text_buffer_)._M_string_length;
    pp_Var16 = visitor->_vptr_basic_json_visitor;
    uStack_b0 = 0;
LAB_0015f48e:
    (*pp_Var16[0xc])(visitor,buf,uStack_b0,this,ec);
LAB_0015f74b:
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
    return;
  }
  std::error_code::operator=(ec,unexpected_eof);
  bVar13 = false;
LAB_0015f7c9:
  this->more_ = (bool)bVar13;
  return;
}

Assistant:

void read_value(json_visitor& visitor, uint8_t type, std::error_code& ec)
    {
        switch (type)
        {
            case jsoncons::bson::bson_type::double_type:
            {
                uint8_t buf[sizeof(double)]; 
                std::size_t n = source_.read(buf, sizeof(double));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(double)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                double res = binary::little_to_native<double>(buf, sizeof(buf));
                visitor.double_value(res, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::symbol_type:
            case jsoncons::bson::bson_type::min_key_type:
            case jsoncons::bson::bson_type::max_key_type:
            case jsoncons::bson::bson_type::string_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::javascript_type:
            {
                text_buffer_.clear();
                read_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(), text_buffer_.size());
                if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::code, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::regex_type:
            {
                text_buffer_.clear();
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                text_buffer_.push_back('/');
                read_cstring(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                visitor.string_value(text_buffer_, semantic_tag::regex, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::document_type: 
            {
                begin_document(visitor,ec);
                break;
            }

            case jsoncons::bson::bson_type::array_type: 
            {
                begin_array(visitor,ec);
                break;
            }
            case jsoncons::bson::bson_type::undefined_type: 
                {
                    visitor.null_value(semantic_tag::undefined, *this, ec);
                    more_ = !cursor_mode_;
                    break;
                }
            case jsoncons::bson::bson_type::null_type: 
            {
                visitor.null_value(semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::bool_type:
            {
                uint8_t c;
                std::size_t n = source_.read(&c, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                visitor.bool_value(c != 0, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::int32_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int32_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::timestamp_type: 
            {
                uint8_t buf[sizeof(uint64_t)]; 
                std::size_t n = source_.read(buf, sizeof(uint64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(uint64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<uint64_t>(buf, sizeof(buf));
                visitor.uint64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::int64_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::none, *this, ec);
                more_ = !cursor_mode_;
                break;
            }

            case jsoncons::bson::bson_type::datetime_type: 
            {
                uint8_t buf[sizeof(int64_t)]; 
                std::size_t n = source_.read(buf, sizeof(int64_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int64_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                auto val = binary::little_to_native<int64_t>(buf, sizeof(buf));
                visitor.int64_value(val, semantic_tag::epoch_milli, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::binary_type: 
            {
                uint8_t buf[sizeof(int32_t)]; 
                std::size_t n = source_.read(buf, sizeof(int32_t));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                const auto len = binary::little_to_native<int32_t>(buf, sizeof(buf));
                if (JSONCONS_UNLIKELY(len < 0))
                {
                    ec = bson_errc::length_is_negative;
                    more_ = false;
                    return;
                }
                uint8_t subtype;
                n = source_.read(&subtype, 1);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != 1))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                bytes_buffer_.clear();
                n = source_reader<Source>::read(source_, bytes_buffer_, len);
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != static_cast<std::size_t>(len)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                visitor.byte_string_value(bytes_buffer_, 
                                                  subtype, 
                                                  *this,
                                                  ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::decimal128_type: 
            {
                uint8_t buf[sizeof(uint64_t)*2]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                decimal128_t dec;
                dec.low = binary::little_to_native<uint64_t>(buf, sizeof(uint64_t));
                dec.high = binary::little_to_native<uint64_t>(buf+sizeof(uint64_t), sizeof(uint64_t));

                text_buffer_.clear();
                text_buffer_.resize(bson::decimal128_limits::buf_size);
                auto r = bson::decimal128_to_chars(&text_buffer_[0], &text_buffer_[0]+text_buffer_.size(), dec);
                visitor.string_value(string_view(text_buffer_.data(),static_cast<std::size_t>(r.ptr-text_buffer_.data())), semantic_tag::float128, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::bson::bson_type::object_id_type: 
            {
                uint8_t buf[12]; 
                std::size_t n = source_.read(buf, sizeof(buf));
                state_stack_.back().pos += n;
                if (JSONCONS_UNLIKELY(n != sizeof(buf)))
                {
                    ec = bson_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                oid_t oid(buf);
                to_string(oid, text_buffer_);

                visitor.string_value(text_buffer_, semantic_tag::id, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            default:
            {
                ec = bson_errc::unknown_type;
                more_ = false;
                return;
            }
        }
    }